

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_frEfr.cpp
# Opt level: O0

void DronePoseLib::ValtonenOrnhagArxiv2021::fast_eigenvector_solver
               (double *eigv,int neig,Matrix<double,_11,_11,_0,_11,_11> *AM,MatrixXcd *sols)

{
  DenseBase<Eigen::Matrix<double,_3,_11,_0,_3,_11>_> *this;
  double *scalar;
  Scalar *pSVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  double dVar4;
  Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,__1,_0,_3,_3>_>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
  SVar5;
  ColXpr local_11c8;
  NegativeReturnType local_1198;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,__1,_true>_> local_1160 [56];
  ColPivHouseholderQR<Eigen::Matrix<double,_3,__1,_0,_3,_3>_> local_1128;
  Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,__1,_0,_3,_3>_>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
  local_ff8;
  Matrix<double,2,1,0,2,1> local_fe8 [8];
  Vector2d s;
  Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true> local_fd0 [48];
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_> local_fa0 [48];
  StorageBaseType local_f70 [48];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>
  local_f40;
  StorageBaseType local_ef0 [48];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>
  local_ec0;
  StorageBaseType local_e70 [48];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>
  local_e40;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>
  local_df0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>
  local_d40;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>
  local_c30;
  Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true> local_ae0 [48];
  StorageBaseType local_ab0 [48];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>
  local_a80;
  StorageBaseType local_a30 [48];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>
  local_a00;
  StorageBaseType local_9b0 [48];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>
  local_980;
  StorageBaseType local_930 [48];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>
  local_900;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>
  local_8b0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>
  local_800;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>
  local_6f0;
  Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true> local_580 [48];
  StorageBaseType local_550 [48];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>
  local_520;
  StorageBaseType local_4d0 [48];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>
  local_4a0;
  StorageBaseType local_450 [48];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>
  local_420;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>
  local_3d0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>
  local_320;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_210 [8];
  Matrix3d AA;
  int j;
  int i_1;
  ConstRowXpr local_190;
  int local_15c;
  double dStack_158;
  int i;
  double zi [5];
  Matrix<double,_3,_11,_0,_3,_11> AMs;
  MatrixXcd *sols_local;
  Matrix<double,_11,_11,_0,_11,_11> *AM_local;
  int neig_local;
  double *eigv_local;
  
  Eigen::Matrix<double,_3,_11,_0,_3,_11>::Matrix((Matrix<double,_3,_11,_0,_3,_11> *)(zi + 4));
  for (local_15c = 0; local_15c < 3; local_15c = local_15c + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>::row
              (&local_190,(DenseBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *)AM,
               (long)fast_eigenvector_solver::ind[local_15c]);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_11,_0,_3,_11>_>::row
              ((RowXpr *)&j,(DenseBase<Eigen::Matrix<double,_3,_11,_0,_3,_11>_> *)(zi + 4),
               (long)local_15c);
    Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,1,11,false>::operator=
              ((Block<Eigen::Matrix<double,3,11,0,3,11>,1,11,false> *)&j,
               (DenseBase<Eigen::Block<const_Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1,_11,_false>_>
                *)&local_190);
  }
  for (AA.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8].
       _4_4_ = 0;
      AA.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8].
      _4_4_ < neig;
      AA.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8].
      _4_4_ = AA.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
              [8]._4_4_ + 1) {
    dStack_158 = eigv[AA.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                      m_data.array[8]._4_4_];
    for (AA.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8].
         _0_4_ = 1;
        AA.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8].
        _0_4_ < 5;
        AA.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8].
        _0_4_ = AA.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array[8]._0_4_ + 1) {
      zi[(long)AA.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
               array[8]._0_4_ + -1] =
           zi[(long)(AA.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                     m_data.array[8]._0_4_ + -1) + -1] *
           eigv[AA.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array[8]._4_4_];
    }
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)local_210);
    this = (DenseBase<Eigen::Matrix<double,_3,_11,_0,_3,_11>_> *)(zi + 4);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_11,_0,_3,_11>_>::col((ColXpr *)local_450,this,0);
    Eigen::operator*(&local_420,zi + 2,local_450);
    scalar = zi + 1;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_11,_0,_3,_11>_>::col((ColXpr *)local_4d0,this,2);
    Eigen::operator*(&local_4a0,scalar,local_4d0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>>
    ::operator+(&local_3d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>>
                 *)&local_420,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>
                 *)&local_4a0);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_11,_0,_3,_11>_>::col((ColXpr *)local_550,this,4);
    Eigen::operator*(&local_520,zi,local_550);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>>
    ::operator+(&local_320,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>>
                 *)&local_3d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>
                 *)&local_520);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col((ColXpr *)local_580,local_210,0);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
              (local_580,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>_>
                *)&local_320);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_11,_0,_3,_11>_>::col((ColXpr *)local_930,this,1);
    Eigen::operator*(&local_900,zi + 2,local_930);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_11,_0,_3,_11>_>::col((ColXpr *)local_9b0,this,3);
    Eigen::operator*(&local_980,scalar,local_9b0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>>
    ::operator+(&local_8b0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>>
                 *)&local_900,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>
                 *)&local_980);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_11,_0,_3,_11>_>::col((ColXpr *)local_a30,this,6);
    Eigen::operator*(&local_a00,zi,local_a30);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>>
    ::operator+(&local_800,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>>
                 *)&local_8b0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>
                 *)&local_a00);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_11,_0,_3,_11>_>::col((ColXpr *)local_ab0,this,8);
    Eigen::operator*(&local_a80,&stack0xfffffffffffffea8,local_ab0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>>
    ::operator+(&local_6f0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>>
                 *)&local_800,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>
                 *)&local_a80);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col((ColXpr *)local_ae0,local_210,1);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
              (local_ae0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>_>
                *)&local_6f0);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_11,_0,_3,_11>_>::col((ColXpr *)local_e70,this,5);
    Eigen::operator*(&local_e40,scalar,local_e70);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_11,_0,_3,_11>_>::col((ColXpr *)local_ef0,this,7);
    Eigen::operator*(&local_ec0,zi,local_ef0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>>
    ::operator+(&local_df0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>>
                 *)&local_e40,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>
                 *)&local_ec0);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_11,_0,_3,_11>_>::col((ColXpr *)local_f70,this,9);
    Eigen::operator*(&local_f40,&stack0xfffffffffffffea8,local_f70);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>>
    ::operator+(&local_d40,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>>
                 *)&local_df0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>
                 *)&local_f40);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_11,_0,_3,_11>_>::col((ColXpr *)local_fa0,this,10);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>>
    ::operator+(&local_c30,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,11,0,3,11>,3,1,true>const>const>>
                 *)&local_d40,local_fa0);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col((ColXpr *)local_fd0,local_210,2);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>::operator=
              (local_fd0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_11,_0,_3,_11>,_3,_1,_true>_>_>
                *)&local_c30);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_210,0,0);
    dVar4 = *pSVar1 - zi[3];
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_210,0,0);
    *pSVar1 = dVar4;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_210,1,1);
    dVar4 = *pSVar1 - zi[3];
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_210,1,1);
    *pSVar1 = dVar4;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_210,2,2);
    dVar4 = *pSVar1 - zi[2];
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_210,2,2);
    *pSVar1 = dVar4;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::leftCols<int>
              ((Type *)local_1160,local_210,2);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_-1,_true>_>::
    colPivHouseholderQr(&local_1128,local_1160);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col(&local_11c8,local_210,2);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::operator-
              (&local_1198,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               &local_11c8);
    SVar5 = Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,3,-1,0,3,3>>>::
            solve<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>const>>
                      ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,3,_1,0,3,3>>> *)
                       &local_1128,
                       (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
                        *)&local_1198);
    local_ff8 = SVar5;
    Eigen::Matrix<double,2,1,0,2,1>::
    Matrix<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,3,_1,0,3,3>>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>const>>>
              (local_fe8,
               (EigenBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,__1,_0,_3,_3>_>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>_>
                *)&local_ff8);
    Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_-1,_0,_3,_3>_>::~ColPivHouseholderQR
              (&local_1128);
    dVar4 = dStack_158;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_-1,_-1,_0,_-1,_-1>,_1>::
             operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,__1,__1,_0,__1,__1>,_1>
                         *)sols,0,
                        (long)AA.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                              m_storage.m_data.array[8]._4_4_);
    std::complex<double>::operator=(pSVar2,dVar4);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)local_fe8,1);
    dVar4 = *pSVar3;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_-1,_-1,_0,_-1,_-1>,_1>::
             operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,__1,__1,_0,__1,__1>,_1>
                         *)sols,1,
                        (long)AA.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                              m_storage.m_data.array[8]._4_4_);
    std::complex<double>::operator=(pSVar2,dVar4);
  }
  return;
}

Assistant:

inline void fast_eigenvector_solver(
    double *eigv,
    int neig,
    const Eigen::Matrix<double, 11, 11> &AM,
    Eigen::MatrixXcd *sols) {
    static const int ind[] = {0, 1, 5};
    // Truncated action matrix containing non-trivial rows
    Eigen::Matrix<double, 3, 11> AMs;
    double zi[5];

    for (int i = 0; i < 3; i++) {
        AMs.row(i) = AM.row(ind[i]);
    }
    for (int i = 0; i < neig; i++) {
        zi[0] = eigv[i];
        for (int j = 1; j < 5; j++) {
            zi[j] = zi[j - 1] * eigv[i];
        }
        Eigen::Matrix3d AA;
        AA.col(0) = zi[3] * AMs.col(0) + zi[2] * AMs.col(2) + zi[1] * AMs.col(4);
        AA.col(1) = zi[3] * AMs.col(1) + zi[2] * AMs.col(3) + zi[1] * AMs.col(6) + zi[0] * AMs.col(8);
        AA.col(2) = zi[2] * AMs.col(5) + zi[1] * AMs.col(7) + zi[0] * AMs.col(9) + AMs.col(10);
        AA(0, 0) = AA(0, 0) - zi[4];
        AA(1, 1) = AA(1, 1) - zi[4];
        AA(2, 2) = AA(2, 2) - zi[3];

        Eigen::Vector2d s = AA.leftCols(2).colPivHouseholderQr().solve(-AA.col(2));
        (*sols)(0, i) = zi[0];
        (*sols)(1, i) = s(1);
    }
}